

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnv_bld.cpp
# Opt level: O2

UBool ucnv_canCreateConverter_63(char *converterName,UErrorCode *err)

{
  bool bVar1;
  UConverterSharedData *mySharedConverterData;
  UConverterLoadArgs stackArgs;
  UConverterNamePieces stackPieces;
  UConverter myUConverter;
  UConverterLoadArgs local_248;
  UConverterNamePieces local_218;
  UConverter local_138;
  
  local_248.locale = (char *)0x0;
  local_248.pkg = (char *)0x0;
  local_248.name = (char *)0x0;
  local_248.size = 0x28;
  local_248.nestedLoads = 0;
  if (*err < U_ILLEGAL_ARGUMENT_ERROR) {
    local_248.onlyTestIsLoadable = '\x01';
    local_248.reserved0 = '\0';
    local_248.reserved = 0;
    local_248.options = 0;
    mySharedConverterData = ucnv_loadSharedData_63(converterName,&local_218,&local_248,err);
    ucnv_createConverterFromSharedData_63(&local_138,mySharedConverterData,&local_248,err);
    ucnv_unloadSharedDataIfReady_63(mySharedConverterData);
    bVar1 = *err < U_ILLEGAL_ARGUMENT_ERROR;
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

U_CFUNC UBool
ucnv_canCreateConverter(const char *converterName, UErrorCode *err) {
    UConverter myUConverter;
    UConverterNamePieces stackPieces;
    UConverterLoadArgs stackArgs=UCNV_LOAD_ARGS_INITIALIZER;
    UConverterSharedData *mySharedConverterData;

    UTRACE_ENTRY_OC(UTRACE_UCNV_OPEN);

    if(U_SUCCESS(*err)) {
        UTRACE_DATA1(UTRACE_OPEN_CLOSE, "test if can open converter %s", converterName);

        stackArgs.onlyTestIsLoadable=TRUE;
        mySharedConverterData = ucnv_loadSharedData(converterName, &stackPieces, &stackArgs, err);
        ucnv_createConverterFromSharedData(
            &myUConverter, mySharedConverterData,
            &stackArgs,
            err);
        ucnv_unloadSharedDataIfReady(mySharedConverterData);
    }

    UTRACE_EXIT_STATUS(*err);
    return U_SUCCESS(*err);
}